

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProductTests.cpp
# Opt level: O3

void __thiscall
(anonymous_namespace)::
test_cartesian_product<std::__cxx11::string(&)(std::__cxx11::string_const&,std::__cxx11::string_const&),std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (_anonymous_namespace_ *this,Results *expected,
          _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
          *converter,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *input0,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *inputs)

{
  code *pcVar1;
  double dVar2;
  char extraout_AL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__tail;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  ResultBuilder DOCTEST_RB;
  ExpressionDecomposer local_124;
  _anonymous_namespace_ *local_120;
  AccumulateResults<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(&)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_118;
  Result local_f0;
  undefined1 local_d0 [32];
  _Alloc_hider local_b0;
  anon_union_24_2_13149d16_for_String_3 local_a0;
  String local_88;
  String local_60;
  AccumulateResults<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(&)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_40;
  Enum local_38;
  
  local_118.results.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.results.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.results.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.converter = anon_unknown.dwarf_34311b::concatenate_2_strings_comma_separated;
  local_120 = this;
  if (input0 != inputs && expected != (Results *)converter) {
    __tail = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)input0;
    do {
      std::
      _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_d0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expected,
                    __tail);
      ApprovalTests::CartesianProduct::Detail::
      apply<(anonymous_namespace)::AccumulateResults<std::__cxx11::string(&)(std::__cxx11::string_const&,std::__cxx11::string_const&)>&,std::tuple<std::__cxx11::string,std::__cxx11::string>>
                (&local_118,
                 (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_d0);
      if ((anon_union_24_2_13149d16_for_String_3 *)local_b0._M_p != &local_a0) {
        operator_delete(local_b0._M_p,(ulong)(local_a0.data.ptr + 1));
      }
      if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
      }
      pbVar3 = __tail + 1;
      __tail = pbVar3;
      if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)inputs) {
        __tail = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)input0;
      }
      expected = (Results *)
                 ((long)expected +
                 (ulong)(pbVar3 ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)inputs)
                 * 0x20);
    } while (expected != (Results *)converter);
  }
  doctest::String::String((String *)&local_f0,"");
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_d0,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/DocTest_Tests/utilities/CartesianProductTests.cpp"
             ,0x45,"results_store.results == expected","",(String *)&local_f0);
  doctest::String::~String((String *)&local_f0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_124,DT_REQUIRE);
  local_40 = &local_118;
  local_38 = local_124.m_at;
  doctest::detail::
  Expression_lhs<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>::
  operator==(&local_f0,
             (Expression_lhs<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
              *)&local_40,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_120);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_d0,&local_f0);
  doctest::String::~String(&local_f0.m_decomp);
  dVar2 = doctest::detail::ResultBuilder::log
                    ((ResultBuilder *)local_d0,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)local_d0);
  doctest::String::~String(&local_60);
  doctest::String::~String(&local_88);
  doctest::String::~String((String *)&local_a0.data);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118.results);
  return;
}

Assistant:

void test_cartesian_product(const Results& expected,
                                Converter&& converter,
                                const Container& input0,
                                const Containers&... inputs)
    {
        auto results_store =
            AccumulateResults<Converter>{Results(), std::forward<Converter>(converter)};
        CartesianProduct::cartesian_product(results_store, input0, inputs...);
        REQUIRE(results_store.results == expected);
    }